

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

uint * __thiscall
fmt::v11::detail::allocator<unsigned_int>::allocate(allocator<unsigned_int> *this,size_t n)

{
  unsigned_long uVar1;
  uint *puVar2;
  bad_alloc *this_00;
  uint *p;
  size_t n_local;
  allocator<unsigned_int> *this_local;
  
  uVar1 = max_value<unsigned_long>();
  if (uVar1 >> 2 < n) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O0/_deps/fmt-src/include/fmt/format.h"
                ,0x2ea,"");
  }
  puVar2 = (uint *)malloc(n << 2);
  if (puVar2 == (uint *)0x0) {
    this_00 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_00);
    __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return puVar2;
}

Assistant:

T* allocate(size_t n) {
    FMT_ASSERT(n <= max_value<size_t>() / sizeof(T), "");
    T* p = static_cast<T*>(malloc(n * sizeof(T)));
    if (!p) FMT_THROW(std::bad_alloc());
    return p;
  }